

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O2

bool __thiscall ll_grammar::GrammarLeft::get_first(GrammarLeft *this,int elemIndex)

{
  pointer pvVar1;
  pointer piVar2;
  pointer pEVar3;
  int i_1;
  int i;
  ulong uVar4;
  int elemIndex_local;
  vector<int,_std::allocator<int>_> temp;
  
  if (elemIndex != -1) {
    pvVar1 = (this->first).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar1[elemIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data + 8) ==
        pvVar1[elemIndex].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pEVar3 = (this->elements).
               super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>.
               _M_impl.super__Vector_impl_data._M_start;
      elemIndex_local = elemIndex;
      if (pEVar3[elemIndex].super_Elem.is_finally == true) {
        std::vector<int,_std::allocator<int>_>::push_back(pvVar1 + elemIndex,&elemIndex_local);
      }
      else {
        temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        piVar2 = (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar2) {
          (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar2;
        }
        for (uVar4 = 0;
            uVar4 < (ulong)(((long)*(pointer *)
                                    ((long)&pEVar3[elemIndex].expression_of_set.
                                            super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                            ._M_impl + 8) -
                            *(long *)&pEVar3[elemIndex].expression_of_set.
                                      super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                      ._M_impl.super__Vector_impl_data) / 0x18); uVar4 = uVar4 + 1)
        {
          calculate_expression_first(this,elemIndex,(int)uVar4,&temp,true);
          public_tool::connect_vector
                    ((this->first).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + elemIndex,&temp);
          pEVar3 = (this->elements).
                   super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        for (uVar4 = 0;
            piVar2 = (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar4 < (ulong)((long)(this->first_temp).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
            uVar4 = uVar4 + 1) {
          calculate_expression_first(this,elemIndex,piVar2[uVar4],&temp,false);
          public_tool::connect_vector
                    ((this->first).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + elemIndex,&temp);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&temp.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
  }
  return elemIndex != -1;
}

Assistant:

bool GrammarLeft::get_first(int elemIndex){

    //空串
    if (elemIndex == -1) return false;

    //这个符号的first集合已经求出来了
    if (first[elemIndex].size() != 0) return true;

    //判断是不是终结符，是的话说明这个first可以直接求
    if (elements[elemIndex].is_finally){
        //是终结符,将自己添加就行
        first[elemIndex].push_back(elemIndex);
    }
    else
    {
        //不是终结符，需要计算这个非终结符的每一个表达式然后在添加上去
        //vector<int> t;
        vector<int> temp;
        this->first_temp.clear();//后续准备
        //计算这个产生式的表达式
        for (int i = 0; i < elements[elemIndex].expression_of_set.size(); i++){
            //计算第i个表达式
            calculate_expression_first(elemIndex, i, temp);
            connect_vector(first[elemIndex], temp);
        }
        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        for (int i = 0; i < first_temp.size(); i++){
            calculate_expression_first(elemIndex, first_temp[i], temp, false);
            connect_vector(first[elemIndex], temp);
        }

    }

    return true;
}